

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<int,char_const(&)[2],unsigned_int,char_const(&)[2],long,char_const(&)[2],long_long>
          (String *__return_storage_ptr__,kj *this,int *params,char (*params_1) [2],uint *params_2,
          char (*params_3) [2],long *params_4,char (*params_5) [2],longlong *params_6)

{
  CappedArray<char,_26UL> *in_stack_ffffffffffffff18;
  CappedArray<char,_14UL> local_e0;
  CappedArray<char,_14UL> local_c8;
  ArrayPtr<const_char> local_b0;
  ArrayPtr<const_char> local_a0;
  ArrayPtr<const_char> local_90;
  CappedArray<char,_26UL> local_80;
  CappedArray<char,_26UL> local_58;
  
  toCharSequence<int>(&local_c8,(int *)this);
  local_90 = toCharSequence<char_const(&)[2]>((char (*) [2])params);
  toCharSequence<unsigned_int>(&local_e0,(uint *)params_1);
  local_a0 = toCharSequence<char_const(&)[2]>((char (*) [2])params_2);
  toCharSequence<long>(&local_58,(long *)params_3);
  local_b0 = toCharSequence<char_const(&)[2]>((char (*) [2])params_4);
  toCharSequence<long_long>(&local_80,(longlong *)params_5);
  _::
  concat<kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>>
            (__return_storage_ptr__,(_ *)&local_c8,(CappedArray<char,_14UL> *)&local_90,
             (ArrayPtr<const_char> *)&local_e0,(CappedArray<char,_14UL> *)&local_a0,
             (ArrayPtr<const_char> *)&local_58,(CappedArray<char,_26UL> *)&local_b0,
             (ArrayPtr<const_char> *)&local_80,in_stack_ffffffffffffff18);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}